

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float128 addFloat128Sigs(float128 a,float128 b,flag zSign,float_status *status)

{
  float128 a_00;
  float128 a_01;
  float128 b_00;
  float128 b_01;
  float128 b_02;
  float128 a_02;
  float128 a_03;
  float128 a_04;
  float128 a_05;
  float128 a_06;
  int iVar1;
  float128 fVar2;
  int local_94;
  uint64_t uStack_90;
  int32_t expDiff;
  uint64_t zSig2;
  uint64_t zSig1;
  uint64_t zSig0;
  uint64_t bSig1;
  uint64_t bSig0;
  uint64_t aSig1;
  uint64_t aSig0;
  int32_t local_50;
  int32_t zExp;
  int32_t bExp;
  int32_t aExp;
  float_status *status_local;
  uint64_t uStack_38;
  flag zSign_local;
  float128 b_local;
  float128 a_local;
  uint64_t local_10;
  
  b_local.low = b.high;
  uStack_38 = b.low;
  local_10 = a.high;
  b_local.high = a.low;
  _bExp = status;
  status_local._7_1_ = zSign;
  bSig0 = extractFloat128Frac1(a);
  a_02.high = local_10;
  a_02.low = b_local.high;
  aSig1 = extractFloat128Frac0(a_02);
  a_03.high = local_10;
  a_03.low = b_local.high;
  zExp = extractFloat128Exp(a_03);
  fVar2.high = b_local.low;
  fVar2.low = uStack_38;
  zSig0 = extractFloat128Frac1(fVar2);
  a_00.high = b_local.low;
  a_00.low = uStack_38;
  bSig1 = extractFloat128Frac0(a_00);
  a_01.high = b_local.low;
  a_01.low = uStack_38;
  local_50 = extractFloat128Exp(a_01);
  local_94 = zExp - local_50;
  if (local_94 < 1) {
    if (local_94 < 0) {
      if (local_50 == 0x7fff) {
        if (bSig1 != 0 || zSig0 != 0) {
          a_05.high = local_10;
          a_05.low = b_local.high;
          b_01.high = b_local.low;
          b_01.low = uStack_38;
          fVar2 = propagateFloat128NaN(a_05,b_01,_bExp);
          return fVar2;
        }
        fVar2 = packFloat128(status_local._7_1_,0x7fff,0,0);
        return fVar2;
      }
      if (zExp == 0) {
        local_94 = local_94 + 1;
      }
      else {
        aSig1 = aSig1 | 0x1000000000000;
      }
      shift128ExtraRightJamming(aSig1,bSig0,0,-local_94,&aSig1,&bSig0,&stack0xffffffffffffff70);
      aSig0._4_4_ = local_50;
      goto LAB_012ca8ba;
    }
    if (zExp == 0x7fff) {
      if (((aSig1 != 0 || bSig0 != 0) || bSig1 != 0) || zSig0 != 0) {
        a_06.high = local_10;
        a_06.low = b_local.high;
        b_02.high = b_local.low;
        b_02.low = uStack_38;
        fVar2 = propagateFloat128NaN(a_06,b_02,_bExp);
        return fVar2;
      }
      a_local.high = b_local.high;
      return stack0xffffffffffffffe8;
    }
    add128(aSig1,bSig0,bSig1,zSig0,&zSig1,&zSig2);
    if (zExp == 0) {
      if (_bExp->flush_to_zero != '\0') {
        if (zSig1 != 0 || zSig2 != 0) {
          float_raise_tricore(0x80,_bExp);
        }
        fVar2 = packFloat128(status_local._7_1_,0,0,0);
        return fVar2;
      }
      fVar2 = packFloat128(status_local._7_1_,0,zSig1,zSig2);
      return fVar2;
    }
    uStack_90 = 0;
    zSig1 = zSig1 | 0x2000000000000;
    aSig0._4_4_ = zExp;
  }
  else {
    if (zExp == 0x7fff) {
      if (aSig1 != 0 || bSig0 != 0) {
        a_04.high = local_10;
        a_04.low = b_local.high;
        b_00.high = b_local.low;
        b_00.low = uStack_38;
        fVar2 = propagateFloat128NaN(a_04,b_00,_bExp);
        return fVar2;
      }
      a_local.high = b_local.high;
      return stack0xffffffffffffffe8;
    }
    if (local_50 == 0) {
      local_94 = local_94 + -1;
    }
    else {
      bSig1 = bSig1 | 0x1000000000000;
    }
    shift128ExtraRightJamming(bSig1,zSig0,0,local_94,&bSig1,&zSig0,&stack0xffffffffffffff70);
    aSig0._4_4_ = zExp;
LAB_012ca8ba:
    aSig1 = aSig1 | 0x1000000000000;
    add128(aSig1,bSig0,bSig1,zSig0,&zSig1,&zSig2);
    iVar1 = aSig0._4_4_ + -1;
    if (zSig1 < 0x2000000000000) goto LAB_012ca939;
  }
  shift128ExtraRightJamming(zSig1,zSig2,uStack_90,1,&zSig1,&zSig2,&stack0xffffffffffffff70);
  iVar1 = aSig0._4_4_;
LAB_012ca939:
  aSig0._4_4_ = iVar1;
  fVar2 = roundAndPackFloat128(status_local._7_1_,aSig0._4_4_,zSig1,zSig2,uStack_90,_bExp);
  return fVar2;
}

Assistant:

static float128 addFloat128Sigs(float128 a, float128 b, flag zSign,
                                float_status *status)
{
    int32_t aExp, bExp, zExp;
    uint64_t aSig0, aSig1, bSig0, bSig1, zSig0, zSig1, zSig2;
    int32_t expDiff;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    expDiff = aExp - bExp;
    if ( 0 < expDiff ) {
        if ( aExp == 0x7FFF ) {
            if (aSig0 | aSig1) {
                return propagateFloat128NaN(a, b, status);
            }
            return a;
        }
        if ( bExp == 0 ) {
            --expDiff;
        }
        else {
            bSig0 |= UINT64_C(0x0001000000000000);
        }
        shift128ExtraRightJamming(
            bSig0, bSig1, 0, expDiff, &bSig0, &bSig1, &zSig2 );
        zExp = aExp;
    }
    else if ( expDiff < 0 ) {
        if ( bExp == 0x7FFF ) {
            if (bSig0 | bSig1) {
                return propagateFloat128NaN(a, b, status);
            }
            return packFloat128( zSign, 0x7FFF, 0, 0 );
        }
        if ( aExp == 0 ) {
            ++expDiff;
        }
        else {
            aSig0 |= UINT64_C(0x0001000000000000);
        }
        shift128ExtraRightJamming(
            aSig0, aSig1, 0, - expDiff, &aSig0, &aSig1, &zSig2 );
        zExp = bExp;
    }
    else {
        if ( aExp == 0x7FFF ) {
            if ( aSig0 | aSig1 | bSig0 | bSig1 ) {
                return propagateFloat128NaN(a, b, status);
            }
            return a;
        }
        add128( aSig0, aSig1, bSig0, bSig1, &zSig0, &zSig1 );
        if ( aExp == 0 ) {
            if (status->flush_to_zero) {
                if (zSig0 | zSig1) {
                    float_raise(float_flag_output_denormal, status);
                }
                return packFloat128(zSign, 0, 0, 0);
            }
            return packFloat128( zSign, 0, zSig0, zSig1 );
        }
        zSig2 = 0;
        zSig0 |= UINT64_C(0x0002000000000000);
        zExp = aExp;
        goto shiftRight1;
    }
    aSig0 |= UINT64_C(0x0001000000000000);
    add128( aSig0, aSig1, bSig0, bSig1, &zSig0, &zSig1 );
    --zExp;
    if ( zSig0 < UINT64_C(0x0002000000000000) ) goto roundAndPack;
    ++zExp;
 shiftRight1:
    shift128ExtraRightJamming(
        zSig0, zSig1, zSig2, 1, &zSig0, &zSig1, &zSig2 );
 roundAndPack:
    return roundAndPackFloat128(zSign, zExp, zSig0, zSig1, zSig2, status);

}